

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseNonIdentifyingStringOrIndex1
          (CFIReaderImpl *this,
          vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
          *valueTable)

{
  byte bVar1;
  pointer psVar2;
  size_t sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  DeadlyImportError *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  psVar2 = (valueTable->
           super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  bVar1 = *(byte *)&(psVar2->super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
  if (bVar1 == 0xff) {
    (valueTable->
    super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(psVar2->
                          super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 1);
    (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
         EmptyFIString;
    p_Var4 = DAT_0095ac80;
    _Var5._M_pi = in_RDX;
  }
  else {
    if (-1 < (char)bVar1) {
      sVar6 = parseEncodedCharacterString3(this);
      _Var5 = sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (0x3f < bVar1) {
        std::
        vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
        ::push_back((vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                     *)in_RDX,(value_type *)this);
        _Var5._M_pi = extraout_RDX;
      }
      goto LAB_006343fc;
    }
    sVar3 = parseInt2((CFIReaderImpl *)valueTable);
    psVar2 = (((_Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                *)&in_RDX->_vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data._M_start;
    if ((ulong)((long)*(pointer *)&in_RDX->_M_use_count - (long)psVar2 >> 4) <= sVar3) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  psVar2[sVar3].
                  super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
         (_func_int **)_Var5._M_pi;
    p_Var4 = psVar2[sVar3].super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
LAB_006343fc:
  sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseNonIdentifyingStringOrIndex1(std::vector<std::shared_ptr<const FIValue>> &valueTable) { // C.14
        uint8_t b = *dataP;
        if (b == 0xff) { // C.26.2
            // empty string
            ++dataP;
            return EmptyFIString;
        }
        else if (b & 0x80) { // C.14.4
            // We have an index
            size_t index = parseInt2();
            if (index >= valueTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            return valueTable[index];
        }
        else { // C.14.3
            // We have a literal
            std::shared_ptr<const FIValue> result = parseEncodedCharacterString3();
            if (b & 0x40) { // C.14.3.1
                valueTable.push_back(result);
            }
            return result;
        }
    }